

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

int Nwk_ManPushForwardFast_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  Nwk_Obj_t *pNStack_28;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pPred_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetTravIdCurrent(pObj);
    iVar1 = Nwk_ObjHasFlow(pObj);
    if (iVar1 == 0) {
      iVar1 = Nwk_ObjIsSink(pObj);
      if (iVar1 == 0) {
        local_2c = 0;
        while( true ) {
          bVar2 = false;
          if (local_2c < pObj->nFanouts) {
            pNStack_28 = pObj->pFanio[pObj->nFanins + local_2c];
            bVar2 = pNStack_28 != (Nwk_Obj_t *)0x0;
          }
          if (!bVar2) {
            return 0;
          }
          iVar1 = Nwk_ManPushForwardFast_rec(pNStack_28,pObj);
          if (iVar1 != 0) break;
          local_2c = local_2c + 1;
        }
        Nwk_ObjSetFlow(pObj);
        pObj_local._4_4_ = Nwk_ObjSetPred(pObj,pPred);
      }
      else {
        Nwk_ObjSetFlow(pObj);
        pObj_local._4_4_ = Nwk_ObjSetPred(pObj,pPred);
      }
    }
    else {
      pObj_local._4_4_ = 0;
    }
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Nwk_ManPushForwardFast_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return 0;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjHasFlow(pObj) )
        return 0;
    if ( Nwk_ObjIsSink(pObj) )
    {
        Nwk_ObjSetFlow(pObj);
        return Nwk_ObjSetPred( pObj, pPred );
    }
    Nwk_ObjForEachFanout( pObj, pNext, i )
        if ( Nwk_ManPushForwardFast_rec( pNext, pObj ) )
        {
            Nwk_ObjSetFlow(pObj);
            return Nwk_ObjSetPred( pObj, pPred );
        }
    return 0;
}